

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_wrapper.cc
# Opt level: O2

fdb_status
fdb_get_kv(fdb_kvs_handle *handle,void *key,size_t keylen,void **value_out,size_t *valuelen_out)

{
  fdb_status status;
  fdb_doc *doc;
  
  doc = (fdb_doc *)0x0;
  status = FDB_RESULT_INVALID_ARGS;
  if ((((valuelen_out != (size_t *)0x0) && (value_out != (void **)0x0)) && (key != (void *)0x0)) &&
     ((0xffffffffffff007f < keylen - 0xff81 &&
      (((handle->kvs_config).custom_cmp == (fdb_custom_cmp_variable)0x0 ||
       (keylen <= (handle->config).blocksize - 0x100)))))) {
    status = fdb_doc_create(&doc,key,keylen,(void *)0x0,0,(void *)0x0,0);
    if (status == FDB_RESULT_SUCCESS) {
      status = fdb_get(handle,doc);
      if (status == FDB_RESULT_SUCCESS) {
        *value_out = doc->body;
        *valuelen_out = doc->bodylen;
        free(doc->key);
        free(doc->meta);
        free(doc);
        status = FDB_RESULT_SUCCESS;
      }
      else if (doc != (fdb_doc *)0x0) {
        fdb_doc_free(doc);
      }
    }
    else {
      if (doc != (fdb_doc *)0x0) {
        fdb_doc_free(doc);
      }
      fdb_log_impl(&handle->log_callback,2,status,
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/api_wrapper.cc"
                   ,"fdb_get_kv",0x41,
                   "Failed to allocate fdb_doc instance for key \'%s\' in fdb_get_kv API.",key);
    }
  }
  return status;
}

Assistant:

LIBFDB_API
fdb_status fdb_get_kv(fdb_kvs_handle *handle,
                      const void *key, size_t keylen,
                      void **value_out, size_t *valuelen_out)
{
    fdb_doc *doc = NULL;
    fdb_status fs;

    if (key == NULL || keylen == 0 || keylen > FDB_MAX_KEYLEN ||
        value_out == NULL || valuelen_out == NULL ||
        (handle->kvs_config.custom_cmp &&
            keylen > handle->config.blocksize - HBTRIE_HEADROOM)) {
        return FDB_RESULT_INVALID_ARGS;
    }

    fs = fdb_doc_create(&doc, key, keylen, NULL, 0, NULL, 0);
    if (fs != FDB_RESULT_SUCCESS) { // LCOV_EXCL_START
        if (doc) {
            fdb_doc_free(doc);
        }
        fdb_log(&handle->log_callback, FDB_LOG_ERROR, fs,
                "Failed to allocate fdb_doc instance for key '%s' in "
                "fdb_get_kv API.", (const char *)key);
        return fs;
    } // LCOV_EXCL_STOP

    fs = fdb_get(handle, doc);
    if (fs != FDB_RESULT_SUCCESS) {
        if (doc) {
            fdb_doc_free(doc);
        }
        return fs;
    }

    *value_out = doc->body;
    *valuelen_out = doc->bodylen;
    if (doc->key) free(doc->key);
    if (doc->meta) free(doc->meta);
    free(doc);

    return fs;
}